

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseChunk
          (Status *__return_storage_ptr__,JsonStreamParser *this,StringPiece chunk)

{
  string local_78;
  undefined1 local_58 [8];
  Status result;
  
  if (chunk.length_ == 0) {
    Status::Status(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  (this->json_).ptr_ = chunk.ptr_;
  (this->json_).length_ = chunk.length_;
  (this->p_).ptr_ = (this->json_).ptr_;
  (this->p_).length_ = (this->json_).length_;
  this->finishing_ = false;
  RunParser((Status *)local_58,this);
  if (local_58._0_4_ == OK) {
    SkipWhitespace(this);
    if ((this->p_).length_ == 0) {
      (this->leftover_)._M_string_length = 0;
      *(this->leftover_)._M_dataplus._M_p = '\0';
    }
    else {
      if ((this->stack_).c.
          super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->stack_).c.
          super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        StringPiece::StringPiece
                  ((StringPiece *)((long)&result.error_message_.field_2 + 8),
                   "Parsing terminated before end of input.");
        ReportFailure(__return_storage_ptr__,this,stack0xffffffffffffffd0);
        goto LAB_0032d471;
      }
      StringPiece::ToString_abi_cxx11_(&local_78,&this->p_);
      std::__cxx11::string::operator=((string *)&this->leftover_,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    Status::Status(__return_storage_ptr__);
  }
  else {
    Status::Status(__return_storage_ptr__,(Status *)local_58);
  }
LAB_0032d471:
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseChunk(StringPiece chunk) {
  // Do not do any work if the chunk is empty.
  if (chunk.empty()) return util::Status();

  p_ = json_ = chunk;

  finishing_ = false;
  util::Status result = RunParser();
  if (!result.ok()) return result;

  SkipWhitespace();
  if (p_.empty()) {
    // If we parsed everything we had, clear the leftover.
    leftover_.clear();
  } else {
    // If we do not expect anything i.e. stack is empty, and we have non-empty
    // string left to parse, we report an error.
    if (stack_.empty()) {
      return ReportFailure("Parsing terminated before end of input.");
    }
    // If we expect future data i.e. stack is non-empty, and we have some
    // unparsed data left, we save it for later parse.
    leftover_ = std::string(p_);
  }
  return util::Status();
}